

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  int iVar1;
  GCstr *str;
  uint64_t uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  BCLine BVar6;
  uint uVar7;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar8;
  char *pcVar9;
  GCtab *t;
  long lVar10;
  TValue *pTVar11;
  GCfunc *fn;
  int iVar12;
  cTValue *frame;
  ulong uVar13;
  char cVar14;
  cTValue *local_50;
  
  if (*what == '>') {
    aVar8 = L->top[-1].field_4;
    if (aVar8.it >> 0xf != 0x1fff7) {
      return 0;
    }
    L->top = L->top + -1;
    what = what + 1;
    local_50 = (cTValue *)0x0;
    frame = (cTValue *)0x0;
  }
  else {
    uVar7 = ar->i_ci;
    frame = (cTValue *)((L->stack).ptr64 + (ulong)(uVar7 & 0xffff) * 8);
    local_50 = (cTValue *)0x0;
    if (0xffff < uVar7) {
      local_50 = frame + (uVar7 >> 0x10);
    }
    aVar8 = (anon_struct_8_2_7fa0a05d_for_TValue_4)frame[-1].u64;
  }
  fn = (GCfunc *)((ulong)aVar8 & 0x7fffffffffff);
  bVar5 = false;
  bVar4 = false;
  do {
    cVar14 = *what;
    if (cVar14 == 'L') {
      bVar5 = true;
    }
    else if (cVar14 == 'S') {
      if ((fn->c).ffid == '\0') {
        lVar10 = *(long *)((long)fn + 0x20);
        iVar12 = *(int *)(lVar10 + -0x20);
        str = *(GCstr **)(lVar10 + -0x28);
        ar->source = (char *)(str + 1);
        lj_debug_shortname(ar->short_src,str,iVar12);
        ar->linedefined = iVar12;
        iVar1 = *(int *)(lVar10 + -0x1c);
        ar->lastlinedefined = iVar1 + iVar12;
        pcVar9 = "main";
        if (iVar1 == 0) {
          pcVar9 = "Lua";
        }
        if (iVar12 != 0) {
          pcVar9 = "Lua";
        }
      }
      else {
        ar->source = "=[C]";
        builtin_strncpy(ar->short_src,"[C]",4);
        ar->linedefined = -1;
        ar->lastlinedefined = -1;
        pcVar9 = "C";
      }
      ar->what = pcVar9;
    }
    else if (cVar14 == 'f') {
      bVar4 = true;
    }
    else if (cVar14 == 'l') {
      BVar6 = -1;
      if (frame != (cTValue *)0x0) {
        BVar6 = debug_frameline(L,fn,local_50);
      }
      ar->currentline = BVar6;
    }
    else if (cVar14 == 'n') {
      if (frame != (cTValue *)0x0) {
        pcVar9 = lj_debug_funcname(L,frame,&ar->name);
        ar->namewhat = pcVar9;
        if (pcVar9 != (char *)0x0) goto LAB_00113160;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
    }
    else {
      if (cVar14 != 'u') {
        if (cVar14 == '\0') {
          if (bVar4) {
            L->top->u64 = (ulong)fn | 0xfffb800000000000;
            pTVar11 = L->top;
            L->top = pTVar11 + 1;
            if ((TValue *)(L->maxstack).ptr64 <= pTVar11 + 1) {
              lj_state_growstack1(L);
            }
          }
          iVar12 = 1;
          if (bVar5) {
            if ((fn->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              lVar10 = *(long *)((long)fn + 0x20);
              lVar3 = *(long *)(lVar10 + -0x18);
              if (lVar3 != 0) {
                iVar12 = *(int *)(lVar10 + -0x20);
                cVar14 = '\x01';
                if (0xff < *(int *)(lVar10 + -0x1c)) {
                  cVar14 = (0xffff < *(int *)(lVar10 + -0x1c)) * '\x02' + '\x02';
                }
                iVar1 = *(int *)(lVar10 + -0x5c);
                for (uVar13 = 0; iVar1 - 1 != uVar13; uVar13 = uVar13 + 1) {
                  if (cVar14 == '\x02') {
                    uVar7 = (uint)*(ushort *)(lVar3 + uVar13 * 2);
                  }
                  else if (cVar14 == '\x01') {
                    uVar7 = (uint)*(byte *)(lVar3 + uVar13);
                  }
                  else {
                    uVar7 = *(uint *)(lVar3 + uVar13 * 4);
                  }
                  lVar10 = (long)(int)uVar7 + (long)iVar12;
                  uVar7 = (uint)lVar10;
                  if (uVar7 < t->asize) {
                    pTVar11 = (TValue *)(lVar10 * 8 + (t->array).ptr64);
                  }
                  else {
                    pTVar11 = lj_tab_setinth(L,t,uVar7);
                  }
                  pTVar11->u64 = 0xfffeffffffffffff;
                }
              }
              L->top->u64 = (ulong)t | 0xfffa000000000000;
            }
            else {
              L->top->u64 = 0xffffffffffffffff;
            }
            iVar12 = 1;
            pTVar11 = L->top;
            L->top = pTVar11 + 1;
            if ((TValue *)(L->maxstack).ptr64 <= pTVar11 + 1) {
              lj_state_growstack1(L);
            }
          }
        }
        else {
          iVar12 = 0;
        }
        return iVar12;
      }
      ar->nups = (uint)(fn->c).nupvalues;
      if (ext != 0) {
        if ((fn->c).ffid == '\0') {
          uVar2 = (fn->c).pc.ptr64;
          ar->nparams = (uint)*(byte *)(uVar2 - 0x5e);
          ar->isvararg = *(byte *)(uVar2 - 0x2b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
LAB_00113160:
    what = what + 1;
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    if (!tvisfunc(func)) return 0;
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lj_assertL(offset != 0, "bad frame offset");
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lj_assertL(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)),
	       "broken frame chain");
    fn = frame_func(frame);
    lj_assertL(fn->c.gct == ~LJ_TFUNC, "bad frame function");
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name, pt->firstline);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}